

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O0

size_t __thiscall
gmlc::concurrency::DelayedDestructor<helics::Broker>::destroyObjects
          (DelayedDestructor<helics::Broker> *this)

{
  bool bVar1;
  long lVar2;
  __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
  __last;
  const_iterator in_RDI;
  shared_ptr<helics::Broker> *element_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *__range6;
  function<void_(std::shared_ptr<helics::Broker>_&)> deleteFunc;
  __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
  loc;
  shared_ptr<helics::Broker> *element;
  iterator __end0;
  iterator __begin0;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *__range4;
  vector<void_*,_std::allocator<void_*>_> epointers;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_> ecall;
  unique_lock<std::timed_mutex> lock;
  milliseconds wait;
  size_t elementSize;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  value_type *in_stack_fffffffffffffea8;
  function<void_(std::shared_ptr<helics::Broker>_&)> *__x;
  iterator in_stack_fffffffffffffeb0;
  anon_class_8_1_b060dbdb_for__M_pred __pred;
  __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
  in_stack_fffffffffffffec0;
  __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
  local_110;
  undefined1 *local_108;
  shared_ptr<helics::Broker> *local_e0;
  shared_ptr<helics::Broker> *local_d8;
  undefined1 *local_c0;
  shared_ptr<helics::Broker> *local_b8;
  shared_ptr<helics::Broker> *local_b0;
  shared_ptr<helics::Broker> *local_a8;
  element_type *local_a0;
  __shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *local_98;
  shared_ptr<helics::Broker> *local_90;
  __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
  local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_80;
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  uint local_48;
  undefined8 local_20;
  size_type local_18;
  size_type local_8;
  
  local_18 = 0xffffffffffffffff;
  local_20 = 200;
  std::unique_lock<std::timed_mutex>::unique_lock();
  bVar1 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                    ((unique_lock<std::timed_mutex> *)
                     CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                     (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffe98);
  if (!bVar1) {
    local_8 = local_18;
    local_48 = 1;
    goto LAB_0050c836;
  }
  local_18 = std::
             vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
             ::size((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                     *)&in_RDI._M_current[2].
                        super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (local_18 != 0) {
    std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
    ::vector((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
              *)0x50c473);
    std::vector<void_*,_std::allocator<void_*>_>::vector
              ((vector<void_*,_std::allocator<void_*>_> *)0x50c480);
    local_80 = &in_RDI._M_current[2].super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
    local_88._M_current =
         (shared_ptr<helics::Broker> *)
         std::
         vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
         ::begin(in_stack_fffffffffffffe98);
    local_90 = (shared_ptr<helics::Broker> *)
               std::
               vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
               ::end(in_stack_fffffffffffffe98);
    while (bVar1 = __gnu_cxx::
                   operator==<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                             ((__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                              (__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                               *)in_stack_fffffffffffffe98), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_98 = (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)
                 __gnu_cxx::
                 __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                 ::operator*(&local_88);
      lVar2 = std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::use_count
                        ((__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)0x50c4fd);
      if (lVar2 == 1) {
        std::
        vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
        push_back((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                   *)in_stack_fffffffffffffeb0._M_current,in_stack_fffffffffffffea8);
        local_a0 = CLI::std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::get(local_98)
        ;
        std::vector<void*,std::allocator<void*>>::emplace_back<helics::Broker*>
                  ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffeb0._M_current,
                   (Broker **)in_stack_fffffffffffffea8);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
      ::operator++(&local_88);
    }
    bVar1 = std::vector<void_*,_std::allocator<void_*>_>::empty
                      ((vector<void_*,_std::allocator<void_*>_> *)
                       in_stack_fffffffffffffeb0._M_current);
    if (bVar1) {
LAB_0050c7c5:
      local_48 = 0;
    }
    else {
      __pred.epointers =
           (vector<void_*,_std::allocator<void_*>_> *)
           &in_RDI._M_current[2].super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
      local_b0 = (shared_ptr<helics::Broker> *)
                 std::
                 vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                 ::begin(in_stack_fffffffffffffe98);
      local_b8 = (shared_ptr<helics::Broker> *)
                 std::
                 vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                 ::end(in_stack_fffffffffffffe98);
      local_c0 = local_78;
      __last = std::
               remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<helics::Broker>*,std::vector<std::shared_ptr<helics::Broker>,std::allocator<std::shared_ptr<helics::Broker>>>>,gmlc::concurrency::DelayedDestructor<helics::Broker>::destroyObjects()::_lambda(auto:1_const&)_1_>
                         ((__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                           )in_RDI._M_current,in_stack_fffffffffffffec0,__pred);
      __x = (function<void_(std::shared_ptr<helics::Broker>_&)> *)
            &in_RDI._M_current[2].super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
      local_a8 = (shared_ptr<helics::Broker> *)__last;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<helics::Broker>const*,std::vector<std::shared_ptr<helics::Broker>,std::allocator<std::shared_ptr<helics::Broker>>>>
      ::__normal_iterator<std::shared_ptr<helics::Broker>*>
                ((__normal_iterator<const_std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                 (__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                  *)in_stack_fffffffffffffe98);
      local_d8 = (shared_ptr<helics::Broker> *)
                 std::
                 vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                 ::end(in_stack_fffffffffffffe98);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<helics::Broker>const*,std::vector<std::shared_ptr<helics::Broker>,std::allocator<std::shared_ptr<helics::Broker>>>>
      ::__normal_iterator<std::shared_ptr<helics::Broker>*>
                ((__normal_iterator<const_std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                 (__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                  *)in_stack_fffffffffffffe98);
      in_stack_fffffffffffffeb0 =
           std::
           vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
           ::erase((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                    *)__pred.epointers,in_RDI,(const_iterator)__last._M_current);
      local_e0 = (shared_ptr<helics::Broker> *)in_stack_fffffffffffffeb0;
      local_18 = std::
                 vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                 ::size((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                         *)&in_RDI._M_current[2].
                            super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
      std::function<void_(std::shared_ptr<helics::Broker>_&)>::function
                ((function<void_(std::shared_ptr<helics::Broker>_&)> *)
                 in_stack_fffffffffffffeb0._M_current,__x);
      std::unique_lock<std::timed_mutex>::unlock
                ((unique_lock<std::timed_mutex> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(std::shared_ptr<helics::Broker>_&)> *)
                         CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      if (bVar1) {
        local_108 = local_60;
        local_110._M_current =
             (shared_ptr<helics::Broker> *)
             std::
             vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
             ::begin(in_stack_fffffffffffffe98);
        std::
        vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
        end(in_stack_fffffffffffffe98);
        while (bVar1 = __gnu_cxx::
                       operator==<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                                 ((__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                                  (__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                                   *)in_stack_fffffffffffffe98), ((bVar1 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
          ::operator*(&local_110);
          std::function<void_(std::shared_ptr<helics::Broker>_&)>::operator()
                    ((function<void_(std::shared_ptr<helics::Broker>_&)> *)
                     CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                     (shared_ptr<helics::Broker> *)in_stack_fffffffffffffe98);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
          ::operator++(&local_110);
        }
      }
      std::
      vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
      clear((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
             *)0x50c75f);
      in_stack_fffffffffffffea7 =
           std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                     ((unique_lock<std::timed_mutex> *)
                      CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                      (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffe98);
      if (!(bool)in_stack_fffffffffffffea7) {
        local_8 = local_18;
      }
      local_48 = (uint)!(bool)in_stack_fffffffffffffea7;
      std::function<void_(std::shared_ptr<helics::Broker>_&)>::~function
                ((function<void_(std::shared_ptr<helics::Broker>_&)> *)0x50c7b6);
      if (local_48 == 0) goto LAB_0050c7c5;
    }
    std::vector<void_*,_std::allocator<void_*>_>::~vector
              ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffeb0._M_current);
    std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
    ::~vector((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
               *)in_stack_fffffffffffffeb0._M_current);
    if (local_48 != 0) goto LAB_0050c836;
  }
  local_8 = std::
            vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
            ::size((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                    *)&in_RDI._M_current[2].
                       super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_48 = 1;
LAB_0050c836:
  std::unique_lock<std::timed_mutex>::~unique_lock
            ((unique_lock<std::timed_mutex> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  return local_8;
}

Assistant:

size_t destroyObjects() noexcept
    {
        std::size_t elementSize{static_cast<std::size_t>(-1)};
        std::chrono::milliseconds wait(std::chrono::milliseconds(200));
        try {
            std::unique_lock<std::timed_mutex> lock(destructionLock,
                                                    std::defer_lock);
            if (!lock.try_lock_for(wait)) {
                return elementSize;
            }
            elementSize = ElementsToBeDestroyed.size();
            if (elementSize > 0) {
                std::vector<std::shared_ptr<X>> ecall;
                std::vector<void*> epointers;
                for (auto& element : ElementsToBeDestroyed) {
                    if (element.use_count() == 1) {
                        ecall.push_back(element);
                        epointers.emplace_back(element.get());
                    }
                }
                if (!epointers.empty()) {
                    // so apparently remove_if can actually call the
                    // destructor for shared_ptrs so the call function needs
                    // to be before this call
                    auto loc =
                        std::remove_if(ElementsToBeDestroyed.begin(),
                                       ElementsToBeDestroyed.end(),
                                       [&epointers](const auto& element) {
                                           return (
                                               (element.use_count() == 2) &&
                                               (std::find(epointers.begin(),
                                                          epointers.end(),
                                                          static_cast<void*>(
                                                              element.get())) !=
                                                epointers.end()));
                                       });
                    ElementsToBeDestroyed.erase(loc,
                                                ElementsToBeDestroyed.end());
                    elementSize = ElementsToBeDestroyed.size();
                    auto deleteFunc = callBeforeDeleteFunction;
                    lock.unlock();
                    // this needs to be done after the lock, so a destructor
                    // can never called while under the lock
                    if (deleteFunc) {
                        for (auto& element : ecall) {
                            deleteFunc(element);
                        }
                    }
                    ecall.clear();  // make sure the destructors get called
                                    // before returning.
                    // reengage the lock so the size is correct
                    if (!lock.try_lock_for(wait)) {
                        return elementSize;
                    }
                }
            }
            return ElementsToBeDestroyed.size();
        }
        catch (...) {
        }
        return elementSize;
    }